

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int HSC_Generic(FORM *form,int columns)

{
  FIELD *pFVar1;
  int local_2c;
  int local_28;
  int local_24;
  int cols_to_go;
  int res;
  FIELD *field;
  int columns_local;
  FORM *form_local;
  
  pFVar1 = form->current;
  local_24 = -0xc;
  local_2c = columns;
  if (columns < 1) {
    local_2c = -columns;
  }
  local_28 = local_2c;
  if (columns < 1) {
    if (form->begincol < local_2c) {
      local_28 = form->begincol;
    }
    if (0 < local_28) {
      form->curcol = form->curcol - local_28;
      form->begincol = form->begincol - local_28;
      local_24 = 0;
    }
  }
  else {
    if (pFVar1->dcols - (int)pFVar1->cols < local_2c + form->begincol) {
      local_28 = (pFVar1->dcols - (int)pFVar1->cols) - form->begincol;
    }
    if (0 < local_28) {
      form->curcol = local_28 + form->curcol;
      form->begincol = local_28 + form->begincol;
      local_24 = 0;
    }
  }
  return local_24;
}

Assistant:

static int HSC_Generic(FORM *form, int columns)
{
  FIELD *field = form->current;
  int res = E_REQUEST_DENIED;
  int cols_to_go = (columns > 0 ? columns : -columns);

  if (columns > 0)
    {
      if ((cols_to_go + form->begincol) > (field->dcols - field->cols))
        cols_to_go = field->dcols - field->cols - form->begincol;
      
      if (cols_to_go > 0)
        {
          form->curcol   += cols_to_go;
          form->begincol += cols_to_go;
          res = E_OK;
        }
    }
  else
    {
      if ( cols_to_go > form->begincol )
        cols_to_go = form->begincol;

      if (cols_to_go > 0)
        {
          form->curcol   -= cols_to_go;
          form->begincol -= cols_to_go;
          res = E_OK;
        }
    }
  return(res);
}